

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

list_node_base * __thiscall nestl::impl::list_iterator<int>::get_list_node(list_iterator<int> *this)

{
  list_iterator<int> *this_local;
  
  if (this->m_node == (list_node_base *)0x0) {
    __assert_fail("m_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x128,
                  "list_node_base *nestl::impl::list_iterator<int>::get_list_node() const [T = int]"
                 );
  }
  if (this->m_node->m_prev == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x128,
                  "list_node_base *nestl::impl::list_iterator<int>::get_list_node() const [T = int]"
                 );
  }
  if (this->m_node->m_next == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x128,
                  "list_node_base *nestl::impl::list_iterator<int>::get_list_node() const [T = int]"
                 );
  }
  if (this->m_node->m_prev->m_next == this->m_node) {
    if (this->m_node->m_next->m_prev == this->m_node) {
      return this->m_node;
    }
    __assert_fail("(m_node)->m_next->m_prev == (m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x128,
                  "list_node_base *nestl::impl::list_iterator<int>::get_list_node() const [T = int]"
                 );
  }
  __assert_fail("(m_node)->m_prev->m_next == (m_node)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                ,0x128,
                "list_node_base *nestl::impl::list_iterator<int>::get_list_node() const [T = int]");
}

Assistant:

list_node_base* get_list_node() const NESTL_NOEXCEPT_SPEC
    {
        NESTL_CHECK_LIST_NODE(m_node);

        return m_node;
    }